

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O1

void enet_peer_disconnect_now(ENetPeer *peer,uint32_t data)

{
  ENetPeerState EVar1;
  ENetHost *host;
  uint32_t uVar2;
  ENetOutgoingCommand *outgoingCommand;
  
  EVar1 = peer->state;
  if (EVar1 == ENET_PEER_STATE_DISCONNECTED) {
    return;
  }
  if ((EVar1 != ENET_PEER_STATE_DISCONNECTING) && (EVar1 != ENET_PEER_STATE_ZOMBIE)) {
    enet_peer_reset_queues(peer);
    outgoingCommand = (ENetOutgoingCommand *)(*(code *)callbacks_0)(0x60);
    if (outgoingCommand == (ENetOutgoingCommand *)0x0) {
      (*(code *)callbacks_2)();
      return;
    }
    *(undefined2 *)&outgoingCommand->command = 0xff44;
    (outgoingCommand->command).disconnect.data =
         data >> 0x18 | (data & 0xff0000) >> 8 | (data & 0xff00) << 8 | data << 0x18;
    outgoingCommand->fragmentOffset = 0;
    outgoingCommand->fragmentLength = 0;
    outgoingCommand->packet = (ENetPacket *)0x0;
    enet_peer_setup_outgoing_command(peer,outgoingCommand);
    host = peer->host;
    uVar2 = enet_time_get();
    host->serviceTime = uVar2;
    enet_protocol_send_outgoing_commands(host,(ENetEvent *)0x0,0);
  }
  enet_peer_reset(peer);
  return;
}

Assistant:

void enet_peer_disconnect_now(ENetPeer* peer, uint32_t data) {
	ENetProtocol command;

	if (peer->state == ENET_PEER_STATE_DISCONNECTED)
		return;

	if (peer->state != ENET_PEER_STATE_ZOMBIE && peer->state != ENET_PEER_STATE_DISCONNECTING) {
		enet_peer_reset_queues(peer);

		command.header.command = ENET_PROTOCOL_COMMAND_DISCONNECT | ENET_PROTOCOL_COMMAND_FLAG_UNSEQUENCED;
		command.header.channelID = 0xFF;
		command.disconnect.data = ENET_HOST_TO_NET_32(data);

		enet_peer_queue_outgoing_command(peer, &command, NULL, 0, 0);
		enet_host_flush(peer->host);
	}

	enet_peer_reset(peer);
}